

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O3

void __thiscall Parse::TPTP::addTagState(TPTP *this,Tag t)

{
  State *pSVar1;
  Tag *pTVar2;
  
  pSVar1 = (this->_states)._cursor;
  if (pSVar1 == (this->_states)._end) {
    Lib::Stack<Parse::TPTP::State>::expand(&this->_states);
    pSVar1 = (this->_states)._cursor;
  }
  *pSVar1 = TAG;
  (this->_states)._cursor = pSVar1 + 1;
  pTVar2 = (this->_tags)._cursor;
  if (pTVar2 == (this->_tags)._end) {
    Lib::Stack<Parse::TPTP::Tag>::expand(&this->_tags);
    pTVar2 = (this->_tags)._cursor;
  }
  *pTVar2 = t;
  (this->_tags)._cursor = pTVar2 + 1;
  return;
}

Assistant:

void TPTP::addTagState(Tag t)
{
  _states.push(TAG);
  _tags.push(t);
}